

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3983::test_get_index(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r;
  uint64_t i;
  unsigned_long b;
  uint64_t uVar2;
  uint64_t index;
  uint64_t local_38;
  
  uVar2 = 0;
  r = roaring64_bitmap_create();
  do {
    roaring64_bitmap_add(r,uVar2);
    uVar2 = uVar2 + 1000;
  } while (uVar2 != 100000);
  uVar2 = 0;
  b = 0;
  do {
    local_38 = 0;
    _Var1 = roaring64_bitmap_get_index(r,uVar2,&local_38);
    _assert_true((ulong)_Var1,"roaring64_bitmap_get_index(r, i * 1000, &index)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                 ,0x1e4);
    _assert_int_equal(local_38,b,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                      ,0x1e5);
    _Var1 = roaring64_bitmap_get_index(r,uVar2 + 1,&local_38);
    _assert_true((ulong)!_Var1,"roaring64_bitmap_get_index(r, i * 1000 + 1, &index)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                 ,0x1e6);
    b = b + 1;
    uVar2 = uVar2 + 1000;
  } while (b != 100);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_get_index) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    for (uint64_t i = 0; i < 100; ++i) {
        roaring64_bitmap_add(r, i * 1000);
    }
    for (uint64_t i = 0; i < 100; ++i) {
        uint64_t index = 0;
        assert_true(roaring64_bitmap_get_index(r, i * 1000, &index));
        assert_int_equal(index, i);
        assert_false(roaring64_bitmap_get_index(r, i * 1000 + 1, &index));
    }
    roaring64_bitmap_free(r);
}